

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_DCtx_loadDictionary_advanced
                 (ZSTD_DCtx *dctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_DDict *pZVar1;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (dictSize != 0 && dict != (void *)0x0) {
    pZVar1 = ZSTD_createDDict_advanced(dict,dictSize,dictLoadMethod,dictContentType,dctx->customMem)
    ;
    dctx->ddictLocal = pZVar1;
    if (pZVar1 == (ZSTD_DDict *)0x0) {
      return 0xffffffffffffffc0;
    }
    dctx->ddict = pZVar1;
    dctx->dictUses = ZSTD_use_indefinitely;
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_loadDictionary_advanced(ZSTD_DCtx* dctx,
                                   const void* dict, size_t dictSize,
                                         ZSTD_dictLoadMethod_e dictLoadMethod,
                                         ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (dict && dictSize != 0) {
        dctx->ddictLocal = ZSTD_createDDict_advanced(dict, dictSize, dictLoadMethod, dictContentType, dctx->customMem);
        RETURN_ERROR_IF(dctx->ddictLocal == NULL, memory_allocation, "NULL pointer!");
        dctx->ddict = dctx->ddictLocal;
        dctx->dictUses = ZSTD_use_indefinitely;
    }
    return 0;
}